

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O2

void lts2::ProxProjectOntoUnitSimplex(float *X,int n,int step)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  float *pfVar8;
  int i_1;
  float mu;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar1 = (ulong)(uint)n;
  pvVar2 = operator_new__((long)n);
  uVar3 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = uVar1;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined1 *)((long)pvVar2 + uVar3) = 0xff;
  }
  bVar5 = false;
  for (iVar4 = 0; (!bVar5 && (iVar4 < n)); iVar4 = iVar4 + 1) {
    fVar9 = 0.0;
    iVar7 = 0;
    pfVar8 = X;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (*(char *)((long)pvVar2 + uVar6) != '\0') {
        fVar9 = fVar9 + *pfVar8;
        iVar7 = iVar7 + 1;
      }
      pfVar8 = pfVar8 + step;
    }
    bVar5 = true;
    pfVar8 = X;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      if (*(char *)((long)pvVar2 + uVar6) == '\0') {
        *pfVar8 = 0.0;
      }
      else {
        fVar10 = *pfVar8 - (fVar9 + -1.0) / (float)iVar7;
        fVar11 = 0.0;
        if (0.0 <= fVar10) {
          fVar11 = fVar10;
        }
        *pfVar8 = fVar11;
        if (fVar10 < 0.0) {
          *(undefined1 *)((long)pvVar2 + uVar6) = 0;
          bVar5 = false;
        }
      }
      pfVar8 = pfVar8 + step;
    }
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

void lts2::ProxProjectOntoUnitSimplex(float* X, int n, int step)
{
  unsigned char* In_complement = new unsigned char[n];
  for (int i = 0; i < n; ++i)
    In_complement[i] = 255;
    
  float* Xtilda = new float[n];
        
  // Iterate
  bool success = false;
  int iterationCount = 0;
  while ( !success && iterationCount < n ) 
  {
    success = true;
        
    // Compute the mean used to project onto V_I
    float mu = 0.0;
    int nonZero = 0;
    for (int i = 0; i < n; ++i)
      if ( In_complement[i] > 0 )
      {
        mu += X[i*step];
        ++nonZero;
      }
    mu -= 1.0;
    mu /= nonZero;
    
    // Compute projections onto V_I and X_I together
    // Note that we can test at the same time the convergence:
    // we have converged when all the components of X tilda are positive.
    for (int i = 0; i < n; ++i)
    {
      // Projection onto V_I : enforce the summation to 1
      if ( In_complement[i] > 0 )
        Xtilda[i] = X[i*step] - mu;
      else
        Xtilda[i] = 0.0;
            
      // Projection onto X_I : enforce the positivity
      X[i*step] = MAX(Xtilda[i], 0.0);
            
      // Convergence check
      if ( Xtilda[i] < 0.0 )
      {
        In_complement[i] = 0;
        success = false;
      }
    }
        
    ++iterationCount;
  }

    
  // Release memory
  delete []In_complement;
  delete []Xtilda;
}